

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O0

void __thiscall wasm::CallCountScanner::visitCall(CallCountScanner *this,Call *curr)

{
  size_type sVar1;
  __atomic_base<unsigned_int> *this_00;
  Call *curr_local;
  CallCountScanner *this_local;
  
  sVar1 = std::
          unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
          ::count(this->counts,&curr->target);
  if (sVar1 != 0) {
    this_00 = &std::
               unordered_map<wasm::Name,_std::atomic<unsigned_int>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>_>
               ::operator[](this->counts,&curr->target)->super___atomic_base<unsigned_int>;
    std::__atomic_base<unsigned_int>::operator++(this_00,0);
    return;
  }
  __assert_fail("counts->count(curr->target) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/ReorderFunctions.cpp"
                ,0x35,"void wasm::CallCountScanner::visitCall(Call *)");
}

Assistant:

void visitCall(Call* curr) {
    // can't add a new element in parallel
    assert(counts->count(curr->target) > 0);
    (*counts)[curr->target]++;
  }